

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

deInt64 vkt::SpirVAssembly::anon_unknown_5::randomInt64LogDistributed(Random *rnd)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deBool dVar4;
  ulong uVar5;
  ulong uVar6;
  
  dVar1 = deRandom_getUint32(&rnd->m_rnd);
  dVar2 = deRandom_getUint32(&rnd->m_rnd);
  dVar3 = deRandom_getUint32(&rnd->m_rnd);
  uVar6 = ~(-1L << ((char)(dVar3 / 0x3f) + (char)dVar3 + 1U & 0x3f)) & CONCAT44(dVar1,dVar2);
  dVar4 = deRandom_getBool(&rnd->m_rnd);
  uVar5 = -uVar6;
  if (dVar4 != 1) {
    uVar5 = uVar6;
  }
  return uVar5;
}

Assistant:

deInt64 randomInt64LogDistributed (de::Random& rnd)
{
	deInt64 val = rnd.getUint64();
	val &= (1ull << rnd.getInt(1, 63)) - 1;
	if (rnd.getBool())
		val = -val;
	return val;
}